

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

UntypedActionResultHolderBase * __thiscall
testing::internal::
FunctionMockerBase<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)>::
UntypedPerformAction
          (FunctionMockerBase<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)>
           *this,void *untyped_action,void *untyped_args)

{
  ActionResultHolder<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_> *pAVar1;
  ArgumentTuple *args;
  Action<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)> action;
  void *untyped_args_local;
  void *untyped_action_local;
  FunctionMockerBase<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)>
  *this_local;
  
  action.impl_.link_.next_ = (linked_ptr_internal *)untyped_args;
  Action<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)>::Action
            ((Action<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)> *)
             &args,(Action<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)>
                    *)untyped_action);
  pAVar1 = ActionResultHolder<std::vector<cv::Rect_<int>,std::allocator<cv::Rect_<int>>>>::
           PerformAction<std::vector<cv::Rect_<int>,std::allocator<cv::Rect_<int>>>(cv::Mat)>
                     ((Action<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)>
                       *)&args,(ArgumentTuple *)action.impl_.link_.next_);
  Action<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)>::~Action
            ((Action<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)> *)
             &args);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }